

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asctime_s.c
# Opt level: O0

int main(void)

{
  int iVar1;
  char *pcVar2;
  undefined1 local_30 [8];
  tm time;
  
  time.tm_yday = 0;
  local_30._0_4_ = 0x34;
  local_30._4_4_ = 3;
  time.tm_sec = 1;
  time.tm_min = 0x10;
  time.tm_hour = 8;
  time.tm_mday = 0x49;
  time.tm_mon = 0;
  time.tm_year = 0;
  time.tm_wday = -1;
  pcVar2 = asctime((tm *)local_30);
  iVar1 = strcmp(pcVar2,"Sun Sep 16 01:03:52 1973\n");
  if (iVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/time/asctime_s.c, line %d - %s\n"
           ,0x37,"strcmp( asctime( &time ), \"Sun Sep 16 01:03:52 1973\\n\" ) == 0");
  }
  local_30._0_4_ = 0;
  local_30._4_4_ = 0;
  time.tm_sec = 0;
  time.tm_min = 1;
  time.tm_hour = 0;
  time.tm_mday = 0;
  time.tm_mon = 0;
  time.tm_year = 0;
  time.tm_wday = -1;
  pcVar2 = asctime((tm *)local_30);
  iVar1 = strcmp(pcVar2,"Sun Jan  1 00:00:00 1900\n");
  if (iVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/time/asctime_s.c, line %d - %s\n"
           ,0x39,"strcmp( asctime( &time ), \"Sun Jan  1 00:00:00 1900\\n\" ) == 0");
  }
  local_30._0_4_ = 0x3c;
  local_30._4_4_ = 0x3b;
  time.tm_sec = 0x17;
  time.tm_min = 0x1f;
  time.tm_hour = 0xb;
  time.tm_mday = 0x1fa3;
  time.tm_mon = 6;
  time.tm_year = 0;
  time.tm_wday = -1;
  pcVar2 = asctime((tm *)local_30);
  iVar1 = strcmp(pcVar2,"Sat Dec 31 23:59:60 9999\n");
  if (iVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/time/asctime_s.c, line %d - %s\n"
           ,0x3b,"strcmp( asctime( &time ), \"Sat Dec 31 23:59:60 9999\\n\" ) == 0");
  }
  return TEST_RESULTS;
}

Assistant:

int main( void )
{
    /* TODO: Constraint handling */

    struct tm time;
    MKTIME( time, 52, 3, 1, 16, 8, 73, 0, 0 );
    TESTCASE( strcmp( asctime( &time ), "Sun Sep 16 01:03:52 1973\n" ) == 0 );
    MKTIME( time, 0, 0, 0, 1, 0, 0, 0, 0 );
    TESTCASE( strcmp( asctime( &time ), "Sun Jan  1 00:00:00 1900\n" ) == 0 );
    MKTIME( time, 60, 59, 23, 31, 11, 8099, 6, 0 );
    TESTCASE( strcmp( asctime( &time ), "Sat Dec 31 23:59:60 9999\n" ) == 0 );
    return TEST_RESULTS;
}